

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O2

void doctest::detail::logAssertNothrow(bool threw,char *expr,Enum assert_type,char *file,int line)

{
  Code code;
  char *pcVar1;
  undefined7 in_register_00000039;
  Color *pCVar2;
  Color col;
  String local_c58;
  String local_c50;
  String local_c48;
  String local_c40;
  char msg [1024];
  char info1 [1024];
  char loc [1024];
  
  pcVar1 = fileForOutput(file);
  snprintf(loc,0x400,"%s(%d)",pcVar1,(ulong)(uint)line);
  if ((int)CONCAT71(in_register_00000039,threw) == 0) {
    msg[0] = ' ';
    msg[1] = 'P';
    msg[2] = 'A';
    msg[3] = 'S';
    msg[4] = 'S';
    msg[5] = 'E';
    msg[6] = 'D';
    msg[7] = '!';
  }
  else {
    msg[0] = ' ';
    msg[1] = 'F';
    msg[2] = 'A';
    msg[3] = 'I';
    msg[4] = 'L';
    msg[5] = 'E';
    msg[6] = 'D';
    msg[7] = '!';
  }
  msg[8] = '\n';
  msg[9] = '\0';
  pcVar1 = getAssertString(assert_type);
  pCVar2 = (Color *)info1;
  snprintf((char *)pCVar2,0x400,"  %s( %s )\n\n",pcVar1,expr);
  if (loc[0] != '\0') {
    Color::use(pCVar2,LightGrey);
    printf("%s",loc);
    pCVar2 = &col;
    Color::~Color(pCVar2);
  }
  code = BrightGreen;
  if (threw) {
    code = Red;
  }
  Color::use(pCVar2,code);
  printf("%s",msg);
  pCVar2 = &col;
  Color::~Color(pCVar2);
  if (info1[0] != '\0') {
    Color::use(pCVar2,Cyan);
    printf("%s",info1);
    Color::~Color(&col);
  }
  String::String(&local_c48,loc);
  String::String(&local_c50,msg);
  String::operator+(&local_c40,&local_c48);
  String::String(&local_c58,info1);
  String::operator+((String *)&col,&local_c40);
  free(_col);
  free(local_c58.m_str);
  free(local_c40.m_str);
  free(local_c50.m_str);
  free(local_c48.m_str);
  return;
}

Assistant:

void logAssertNothrow(bool threw, const char* expr, assertType::Enum assert_type,
                          const char* file, int line) {
        char loc[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        DOCTEST_SNPRINTF(loc, DOCTEST_COUNTOF(loc), "%s(%d)", fileForOutput(file), line);

        char msg[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        if(!threw)
            DOCTEST_SNPRINTF(msg, DOCTEST_COUNTOF(msg), " PASSED!\n");
        else
            DOCTEST_SNPRINTF(msg, DOCTEST_COUNTOF(msg), " FAILED!\n");

        char info1[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        DOCTEST_SNPRINTF(info1, DOCTEST_COUNTOF(info1), "  %s( %s )\n\n",
                         getAssertString(assert_type), expr);

        DOCTEST_PRINTF_COLORED(loc, Color::LightGrey);
        DOCTEST_PRINTF_COLORED(msg, !threw ? Color::BrightGreen : Color::Red);
        DOCTEST_PRINTF_COLORED(info1, Color::Cyan);

        printToDebugConsole(String(loc) + msg + info1);
    }